

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp.hpp
# Opt level: O0

void __thiscall just::temp::directory::directory(directory *this)

{
  char *pcVar1;
  runtime_error *this_00;
  char *p;
  char tmp [17];
  directory *this_local;
  
  unique0x100000b7 = this;
  std::__cxx11::string::string((string *)this);
  p = (char *)0x73756a2f706d742f;
  builtin_strncpy(tmp,"t-XXXXXX",9);
  pcVar1 = mkdtemp((char *)&p);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)this,pcVar1);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Error creating temporary directory");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

directory()
      {
#ifdef _WIN32
        const std::string temp_dir = get_temp_path();
        char tmp[MAX_PATH + 1];
        if (GetTempFileName(temp_dir.c_str(), "just-", 0, tmp))
        {
          if (DeleteFile(tmp))
          {
            if (CreateDirectory(tmp, NULL))
            {
              _path = tmp;
            }
            else
            {
              throw std::runtime_error("Error creating temporary directory");
            }
          }
          else
          {
            throw std::runtime_error("Error deleting temporary file");
          }
        }
        else
        {
          throw
            std::runtime_error(
              "Error choosing unique name for the temporary directory"
            );
        }
#else
        char tmp[] = "/tmp/just-XXXXXX";
        if (char* const p = mkdtemp(tmp))
        {
          _path = p;
        }
        else
        {
          throw std::runtime_error("Error creating temporary directory");
        }
#endif
      }